

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray.c
# Opt level: O0

uint32_t PackedArray_get(PackedArray *a,uint32_t offset)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  sbyte sVar6;
  byte bVar7;
  uint32_t high;
  uint32_t low;
  uint32_t out;
  uint32_t mask;
  uint32_t bitsAvailable;
  uint32_t startBit;
  uint32_t bitsPerItem;
  uint32_t *in;
  uint32_t offset_local;
  PackedArray *a_local;
  
  if (a != (PackedArray *)0x0) {
    uVar1 = a->bitsPerItem;
    puVar5 = a[1].padding + (((ulong)offset * (ulong)uVar1 >> 5) - 2);
    uVar2 = offset * uVar1 & 0x1f;
    uVar3 = 0x20 - uVar2;
    uVar4 = (int)(1L << ((byte)uVar1 & 0x3f)) - 1;
    sVar6 = (sbyte)uVar2;
    if (uVar3 < uVar1) {
      bVar7 = (byte)uVar3;
      high = *puVar5 >> sVar6 ^
             (*puVar5 >> sVar6 ^ puVar5[1] << (0x20U - sVar6 & 0x1f)) &
             (uVar4 >> (bVar7 & 0x1f)) << (bVar7 & 0x1f);
    }
    else {
      high = *puVar5 >> sVar6 & uVar4;
    }
    return high;
  }
  __assert_fail("a != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ivan2kh[P]sort-big-file-with-a-limited-memory/PackedArray.c"
                ,0x223,"uint32_t PackedArray_get(const PackedArray *, const uint32_t)");
}

Assistant:

uint32_t PackedArray_get(const PackedArray* a, const uint32_t offset)
{
  const uint32_t* __restrict in;
  uint32_t bitsPerItem;
  uint32_t startBit;
  uint32_t bitsAvailable;
  uint32_t mask;
  uint32_t out;

  PACKEDARRAY_ASSERT(a != NULL);

  bitsPerItem = a->bitsPerItem;

  in = &a->buffer[((uint64_t)offset * (uint64_t)bitsPerItem) / 32];
  startBit = ((uint64_t)offset * (uint64_t)bitsPerItem) % 32;

  bitsAvailable = 32 - startBit;

  mask = (uint32_t)(1ULL << bitsPerItem) - 1;

  if (bitsPerItem <= bitsAvailable)
  {
    out = (in[0] >> startBit) & mask;
  }
  else
  {
    // out spans 2 buffer cells
    uint32_t low, high;

    low = in[0] >> startBit;
    high = in[1] << (32 - startBit);

    out = low ^ ((low ^ high) & (mask >> bitsAvailable << bitsAvailable));
  }

  return out;
}